

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

void __thiscall Reducer::loadWorking(Reducer *this)

{
  ToolOptions *this_00;
  type pMVar1;
  pointer pMVar2;
  undefined1 local_220 [12];
  FeatureSet local_214 [101];
  ParseException *p;
  string local_78 [48];
  string local_48 [36];
  undefined1 local_24 [8];
  ModuleReader reader;
  Reducer *this_local;
  
  std::make_unique<wasm::Module>();
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator=
            (&this->module,
             (unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)&reader.profile);
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
            ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)&reader.profile);
  wasm::ModuleReader::ModuleReader((ModuleReader *)local_24);
  std::__cxx11::string::string(local_48,(string *)&this->working);
  pMVar1 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator*
                     (&this->module);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"",(allocator<char> *)((long)&p + 7));
  wasm::ModuleReader::read(local_24,local_48,pMVar1,local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&p + 7));
  std::__cxx11::string::~string(local_48);
  pMVar2 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                     (&this->module);
  if ((pMVar2->hasFeaturesSection & 1U) == 0) {
    wasm::FeatureSet::FeatureSet(local_214,0x1efff);
    pMVar2 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                       (&this->module);
    (pMVar2->features).features = local_214[0].features;
  }
  this_00 = this->toolOptions;
  pMVar1 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator*
                     (&this->module);
  wasm::ToolOptions::applyFeatures(this_00,pMVar1);
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator*(&this->module);
  std::make_unique<wasm::Builder,wasm::Module&>((Module *)local_220);
  std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator=
            (&this->builder,
             (unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)local_220);
  std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::~unique_ptr
            ((unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)local_220);
  pMVar2 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::get(&this->module);
  wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::setModule
            (&(this->
              super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
              ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
              super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,pMVar2);
  return;
}

Assistant:

void loadWorking() {
    module = std::make_unique<Module>();
    ModuleReader reader;
    try {
      reader.read(working, *module);
    } catch (ParseException& p) {
      p.dump(std::cerr);
      std::cerr << '\n';
      Fatal() << "error in parsing working wasm binary";
    }

    // If there is no features section, assume we may need them all (without
    // this, a module with no features section but that uses e.g. atomics and
    // bulk memory would not work).
    if (!module->hasFeaturesSection) {
      module->features = FeatureSet::All;
    }
    // Apply features the user passed on the commandline.
    toolOptions.applyFeatures(*module);

    builder = std::make_unique<Builder>(*module);
    setModule(module.get());
  }